

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-impl.cpp
# Opt level: O0

string * gguf_kv_to_str_abi_cxx11_(gguf_context *ctx_gguf,int i)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  ostream *poVar1;
  int in_EDX;
  undefined8 in_RSI;
  string *in_RDI;
  string val;
  int j;
  stringstream ss;
  void *data;
  int arr_n;
  gguf_type arr_type;
  gguf_type type;
  allocator<char> *in_stack_fffffffffffffcf8;
  allocator<char> *in_stack_fffffffffffffd00;
  allocator<char> *in_stack_fffffffffffffd08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd10;
  string *search;
  string *in_stack_fffffffffffffd20;
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [39];
  allocator<char> local_269;
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [39];
  allocator<char> local_219;
  string local_218 [39];
  allocator<char> local_1f1;
  string local_1f0 [36];
  int local_1cc;
  stringstream local_1c8 [16];
  ostream local_1b8 [376];
  string *local_40;
  int local_34;
  int local_30;
  allocator<char> local_19;
  int local_18;
  int local_14;
  undefined8 local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_18 = gguf_get_kv_type(in_RSI,(long)in_EDX);
  if (local_18 == 8) {
    gguf_get_val_str(local_10,(long)local_14);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffd10,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00
              );
    std::allocator<char>::~allocator(&local_19);
  }
  else if (local_18 == 9) {
    local_30 = gguf_get_arr_type(local_10,(long)local_14);
    local_34 = gguf_get_arr_n(local_10,(long)local_14);
    if (local_30 == 8) {
      search = (string *)0x0;
    }
    else {
      search = (string *)gguf_get_arr_data(local_10,(long)local_14);
    }
    local_40 = search;
    std::__cxx11::stringstream::stringstream(local_1c8);
    std::operator<<(local_1b8,"[");
    for (local_1cc = 0; local_1cc < local_34; local_1cc = local_1cc + 1) {
      if (local_30 == 8) {
        this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               gguf_get_arr_str(local_10,(long)local_14,(long)local_1cc);
        in_stack_fffffffffffffd08 = &local_1f1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        std::allocator<char>::~allocator(&local_1f1);
        in_stack_fffffffffffffd00 = &local_219;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        in_stack_fffffffffffffcf8 = &local_241;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        replace_all(in_stack_fffffffffffffd20,search,this);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator(&local_241);
        std::__cxx11::string::~string(local_218);
        std::allocator<char>::~allocator(&local_219);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this,(char *)in_stack_fffffffffffffd08,in_stack_fffffffffffffd00);
        replace_all(in_stack_fffffffffffffd20,search,this);
        std::__cxx11::string::~string(local_290);
        std::allocator<char>::~allocator(&local_291);
        std::__cxx11::string::~string(local_268);
        std::allocator<char>::~allocator(&local_269);
        poVar1 = std::operator<<(local_1b8,'\"');
        poVar1 = std::operator<<(poVar1,local_1f0);
        std::operator<<(poVar1,'\"');
        std::__cxx11::string::~string(local_1f0);
      }
      else if (local_30 == 9) {
        std::operator<<(local_1b8,"???");
      }
      else {
        gguf_data_to_str_abi_cxx11_
                  ((gguf_type)((ulong)in_stack_fffffffffffffd08 >> 0x20),in_stack_fffffffffffffd00,
                   (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
        std::operator<<(local_1b8,local_2b8);
        std::__cxx11::string::~string(local_2b8);
      }
      if (local_1cc < local_34 + -1) {
        std::operator<<(local_1b8,", ");
      }
    }
    std::operator<<(local_1b8,"]");
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  else {
    gguf_get_val_data(local_10,(long)local_14);
    gguf_data_to_str_abi_cxx11_
              ((gguf_type)((ulong)in_stack_fffffffffffffd08 >> 0x20),in_stack_fffffffffffffd00,
               (int)((ulong)in_stack_fffffffffffffcf8 >> 0x20));
  }
  return in_RDI;
}

Assistant:

std::string gguf_kv_to_str(const struct gguf_context * ctx_gguf, int i) {
    const enum gguf_type type = gguf_get_kv_type(ctx_gguf, i);

    switch (type) {
        case GGUF_TYPE_STRING:
            return gguf_get_val_str(ctx_gguf, i);
        case GGUF_TYPE_ARRAY:
            {
                const enum gguf_type arr_type = gguf_get_arr_type(ctx_gguf, i);
                int arr_n = gguf_get_arr_n(ctx_gguf, i);
                const void * data = arr_type == GGUF_TYPE_STRING ? nullptr : gguf_get_arr_data(ctx_gguf, i);
                std::stringstream ss;
                ss << "[";
                for (int j = 0; j < arr_n; j++) {
                    if (arr_type == GGUF_TYPE_STRING) {
                        std::string val = gguf_get_arr_str(ctx_gguf, i, j);
                        // escape quotes
                        replace_all(val, "\\", "\\\\");
                        replace_all(val, "\"", "\\\"");
                        ss << '"' << val << '"';
                    } else if (arr_type == GGUF_TYPE_ARRAY) {
                        ss << "???";
                    } else {
                        ss << gguf_data_to_str(arr_type, data, j);
                    }
                    if (j < arr_n - 1) {
                        ss << ", ";
                    }
                }
                ss << "]";
                return ss.str();
            }
        default:
            return gguf_data_to_str(type, gguf_get_val_data(ctx_gguf, i), 0);
    }
}